

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O0

void Abc_MfsWinMarkTfi_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vCone_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsDiv.c"
                      ,0x39,"void Abc_MfsWinMarkTfi_rec(Abc_Obj_t *, Vec_Ptr_t *)");
      }
      for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
        pObj_00 = Abc_ObjFanin(pObj,local_24);
        Abc_MfsWinMarkTfi_rec(pObj_00,vCone);
      }
      Vec_PtrPush(vCone,pObj);
    }
    else {
      Vec_PtrPush(vCone,pObj);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks and collects the TFI cone of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_MfsWinMarkTfi_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vCone, pObj );
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
    // visit the fanins of the node
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_MfsWinMarkTfi_rec( pFanin, vCone );
    Vec_PtrPush( vCone, pObj );
}